

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Texture2DMipmapCase::init(Texture2DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  Texture2D *this_00;
  ulong uVar4;
  ulong extraout_RAX;
  NotSupportedError *this_01;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  RGBA local_64;
  ulong local_60;
  int local_54;
  string local_50;
  
  if (this->m_coordType == COORDTYPE_PROJECTED) {
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    if (0 < *(int *)(CONCAT44(extraout_var,iVar2) + 0x20)) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "Projected lookup validation not supported in multisample config",
                 (allocator<char> *)&local_64);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  uVar5 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar5 = this->m_width;
  }
  uVar4 = 0x20;
  if (uVar5 != 0) {
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar4 = (ulong)(uVar3 ^ 0x1f);
  }
  local_54 = 0x1f - (int)uVar4;
  local_60 = (ulong)(0x20 - (int)uVar4);
  lVar6 = 0;
  for (uVar7 = 0; local_60 != uVar7; uVar7 = uVar7 + 1) {
    uVar3 = (int)(0xff / (long)local_54) * (int)uVar7;
    uVar5 = uVar3;
    if (0xfe < uVar3) {
      uVar5 = 0xff;
    }
    uVar5 = uVar5 * 0x10100 ^ 0xff00ffff;
    if ((int)uVar3 < 0) {
      uVar5 = 0xff00ffff;
    }
    tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,(int)uVar7);
    pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_64.m_value = uVar5;
    tcu::RGBA::toVec(&local_64);
    tcu::clear((PixelBufferAccess *)
               ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar6 + -8),
               (Vec4 *)&local_50);
    lVar6 = lVar6 + 0x28;
    uVar4 = extraout_RAX;
  }
  return (int)uVar4;
}

Assistant:

void Texture2DMipmapCase::init (void)
{
	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = deLog2Floor32(de::max(m_width, m_height))+1;

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}